

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall
AActor::TakeInventory
          (AActor *this,PClassActor *itemclass,int amount,bool fromdecorate,bool notakeinfinite)

{
  int iVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  AInventory *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar6;
  PClass *pPVar7;
  int iVar8;
  bool bVar9;
  
  iVar8 = -amount;
  if (0 < amount) {
    iVar8 = amount;
  }
  pAVar5 = FindInventory(this,itemclass,false);
  pPVar6 = AHexenArmor::RegistrationInfo.MyClass;
  if (pAVar5 == (AInventory *)0x0) {
    return false;
  }
  iVar1 = pAVar5->Amount;
  if (fromdecorate) {
    if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
      (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar3 = AAmmo::RegistrationInfo.MyClass;
    pPVar2 = (pAVar5->super_AActor).super_DThinker.super_DObject.Class;
    bVar9 = pPVar2 != (PClass *)0x0;
    pPVar7 = pPVar2;
    if (pPVar2 != pPVar6 && bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar6) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar9) {
      if ((notakeinfinite) &&
         (((dmflags.Value._1_1_ & 8) != 0 ||
          ((this->player != (player_t *)0x0 && ((this->player->cheats & 0x800000) != 0)))))) {
        if (pPVar2 == (PClass *)0x0) {
          iVar4 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
          (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_00,iVar4);
        }
        pPVar6 = (pAVar5->super_AActor).super_DThinker.super_DObject.Class;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (bVar9) {
          return false;
        }
      }
      if ((amount != 0) && (iVar4 = pAVar5->Amount - iVar8, iVar4 != 0 && iVar8 <= pAVar5->Amount))
      {
        pAVar5->Amount = iVar4;
        return 0 < iVar1;
      }
      (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar5);
      return 0 < iVar1;
    }
  }
  else {
    pAVar5->Amount = iVar1 - iVar8;
    if (iVar1 - iVar8 == 0 || iVar1 < iVar8) {
      (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar5);
    }
  }
  return false;
}

Assistant:

bool AActor::TakeInventory(PClassActor *itemclass, int amount, bool fromdecorate, bool notakeinfinite)
{
	amount = abs(amount);
	AInventory *item = FindInventory(itemclass);

	if (item == NULL)
		return false;

	if (!fromdecorate)
	{
		item->Amount -= amount;
		if (item->Amount <= 0)
		{
			item->DepleteOrDestroy();
		}
		// It won't be used in non-decorate context, so return false here
		return false;
	}

	bool result = false;
	if (item->Amount > 0)
	{
		result = true;
	}

	if (item->IsKindOf(RUNTIME_CLASS(AHexenArmor)))
		return false;

	// Do not take ammo if the "no take infinite/take as ammo depletion" flag is set
	// and infinite ammo is on
	if (notakeinfinite &&
	((dmflags & DF_INFINITE_AMMO) || (player && player->cheats & CF_INFINITEAMMO)) &&
		item->IsKindOf(RUNTIME_CLASS(AAmmo)))
	{
		// Nothing to do here, except maybe res = false;? Would it make sense?
		result = false;
	}
	else if (!amount || amount>=item->Amount)
	{
		item->DepleteOrDestroy();
	}
	else item->Amount-=amount;

	return result;
}